

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void __thiscall
btSoftBody::btSoftBody
          (btSoftBody *this,btSoftBodyWorldInfo *worldInfo,int node_count,btVector3 *x,btScalar *m)

{
  undefined8 *puVar1;
  btScalar *pbVar2;
  undefined8 *puVar3;
  Node *pNVar4;
  undefined8 uVar5;
  Material *pMVar6;
  btDbvtNode *pbVar7;
  ulong uVar8;
  ulong uVar9;
  btScalar r;
  btScalar bVar10;
  btScalar bVar11;
  btScalar bVar12;
  btScalar bVar13;
  Node local_a8;
  
  btCollisionObject::btCollisionObject(&this->super_btCollisionObject);
  (this->super_btCollisionObject)._vptr_btCollisionObject = (_func_int **)&PTR__btSoftBody_001f2308;
  (this->m_collisionDisabledObjects).m_ownsMemory = true;
  (this->m_collisionDisabledObjects).m_data = (btCollisionObject **)0x0;
  (this->m_collisionDisabledObjects).m_size = 0;
  (this->m_collisionDisabledObjects).m_capacity = 0;
  this->m_softBodySolver = (btSoftBodySolver *)0x0;
  Config::Config(&this->m_cfg);
  Pose::Pose(&this->m_pose);
  this->m_worldInfo = worldInfo;
  (this->m_notes).m_ownsMemory = true;
  (this->m_notes).m_data = (Note *)0x0;
  (this->m_notes).m_size = 0;
  (this->m_notes).m_capacity = 0;
  (this->m_nodes).m_ownsMemory = true;
  (this->m_nodes).m_data = (Node *)0x0;
  (this->m_nodes).m_size = 0;
  (this->m_nodes).m_capacity = 0;
  (this->m_links).m_ownsMemory = true;
  (this->m_links).m_data = (Link *)0x0;
  (this->m_links).m_size = 0;
  (this->m_links).m_capacity = 0;
  (this->m_faces).m_ownsMemory = true;
  (this->m_faces).m_data = (Face *)0x0;
  (this->m_faces).m_size = 0;
  (this->m_faces).m_capacity = 0;
  (this->m_tetras).m_ownsMemory = true;
  (this->m_tetras).m_data = (Tetra *)0x0;
  (this->m_tetras).m_size = 0;
  (this->m_tetras).m_capacity = 0;
  (this->m_anchors).m_ownsMemory = true;
  (this->m_anchors).m_data = (Anchor *)0x0;
  (this->m_anchors).m_size = 0;
  (this->m_anchors).m_capacity = 0;
  (this->m_rcontacts).m_ownsMemory = true;
  (this->m_rcontacts).m_data = (RContact *)0x0;
  (this->m_rcontacts).m_size = 0;
  (this->m_rcontacts).m_capacity = 0;
  (this->m_scontacts).m_ownsMemory = true;
  (this->m_scontacts).m_data = (SContact *)0x0;
  (this->m_scontacts).m_size = 0;
  (this->m_scontacts).m_capacity = 0;
  (this->m_joints).m_ownsMemory = true;
  (this->m_joints).m_data = (Joint **)0x0;
  (this->m_joints).m_size = 0;
  (this->m_joints).m_capacity = 0;
  (this->m_materials).m_ownsMemory = true;
  (this->m_materials).m_data = (Material **)0x0;
  (this->m_materials).m_size = 0;
  (this->m_materials).m_capacity = 0;
  btDbvt::btDbvt(&this->m_ndbvt);
  btDbvt::btDbvt(&this->m_fdbvt);
  btDbvt::btDbvt(&this->m_cdbvt);
  (this->m_clusters).m_ownsMemory = true;
  (this->m_clusters).m_data = (Cluster **)0x0;
  (this->m_clusters).m_size = 0;
  (this->m_clusters).m_capacity = 0;
  (this->m_clusterConnectivity).m_ownsMemory = true;
  (this->m_clusterConnectivity).m_data = (bool *)0x0;
  (this->m_clusterConnectivity).m_size = 0;
  (this->m_clusterConnectivity).m_capacity = 0;
  (this->m_userIndexMapping).m_ownsMemory = true;
  (this->m_userIndexMapping).m_data = (int *)0x0;
  (this->m_userIndexMapping).m_size = 0;
  (this->m_userIndexMapping).m_capacity = 0;
  initDefaults(this);
  pMVar6 = appendMaterial(this);
  pMVar6->m_kLST = 1.0;
  pMVar6->m_kAST = 1.0;
  pMVar6->m_kVST = 1.0;
  pMVar6->m_flags = 1;
  (*((this->super_btCollisionObject).m_collisionShape)->_vptr_btCollisionShape[0xc])();
  local_a8.m_im = 0.0;
  local_a8.m_area = 0.0;
  local_a8.m_leaf = (btDbvtNode *)0x0;
  local_a8.m_n.m_floats[0] = 0.0;
  local_a8.m_n.m_floats[1] = 0.0;
  local_a8.m_n.m_floats[2] = 0.0;
  local_a8.m_n.m_floats[3] = 0.0;
  local_a8.m_f.m_floats[0] = 0.0;
  local_a8.m_f.m_floats[1] = 0.0;
  local_a8.m_f.m_floats[2] = 0.0;
  local_a8.m_f.m_floats[3] = 0.0;
  local_a8.m_v.m_floats[0] = 0.0;
  local_a8.m_v.m_floats[1] = 0.0;
  local_a8.m_v.m_floats[2] = 0.0;
  local_a8.m_v.m_floats[3] = 0.0;
  local_a8.m_q.m_floats[0] = 0.0;
  local_a8.m_q.m_floats[1] = 0.0;
  local_a8.m_q.m_floats[2] = 0.0;
  local_a8.m_q.m_floats[3] = 0.0;
  local_a8.m_x.m_floats[0] = 0.0;
  local_a8.m_x.m_floats[1] = 0.0;
  local_a8.m_x.m_floats[2] = 0.0;
  local_a8.m_x.m_floats[3] = 0.0;
  local_a8.super_Feature.super_Element.m_tag = (void *)0x0;
  local_a8.super_Feature.m_material = (Material *)0x0;
  local_a8._112_8_ = 0;
  btAlignedObjectArray<btSoftBody::Node>::resize(&this->m_nodes,node_count,&local_a8);
  uVar8 = 0;
  uVar9 = (ulong)(uint)node_count;
  if (node_count < 1) {
    uVar9 = uVar8;
  }
  for (; uVar9 * 0x78 != uVar8; uVar8 = uVar8 + 0x78) {
    pNVar4 = (this->m_nodes).m_data;
    bVar10 = 0.0;
    bVar11 = 0.0;
    bVar12 = 0.0;
    bVar13 = 0.0;
    puVar1 = (undefined8 *)((long)(&pNVar4->m_n + 1) + uVar8);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)(pNVar4->m_n).m_floats + uVar8);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)(pNVar4->m_f).m_floats + uVar8);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)(pNVar4->m_v).m_floats + uVar8);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)(pNVar4->m_q).m_floats + uVar8);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)(pNVar4->m_x).m_floats + uVar8);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&(((Node *)(&pNVar4->m_x + -1))->super_Feature).super_Element.m_tag + uVar8);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)(&pNVar4->m_n + 2) + uVar8) = 0;
    if (x == (btVector3 *)0x0) {
      x = (btVector3 *)0x0;
    }
    else {
      bVar10 = x->m_floats[0];
      bVar11 = x->m_floats[1];
      bVar12 = x->m_floats[2];
      bVar13 = x->m_floats[3];
      x = x + 1;
    }
    pbVar2 = (btScalar *)((long)(pNVar4->m_x).m_floats + uVar8);
    *pbVar2 = bVar10;
    pbVar2[1] = bVar11;
    pbVar2[2] = bVar12;
    pbVar2[3] = bVar13;
    puVar1 = (undefined8 *)((long)(pNVar4->m_x).m_floats + uVar8);
    uVar5 = puVar1[1];
    puVar3 = (undefined8 *)((long)(pNVar4->m_q).m_floats + uVar8);
    *puVar3 = *puVar1;
    puVar3[1] = uVar5;
    if (m == (btScalar *)0x0) {
      m = (btScalar *)0x0;
      bVar10 = 1.0;
    }
    else {
      bVar10 = *m;
      m = m + 1;
    }
    *(uint *)((long)(&pNVar4->m_n + 1) + uVar8) = -(uint)(0.0 < bVar10) & (uint)(1.0 / bVar10);
    btDbvtAabbMm::FromCR
              ((btDbvtAabbMm *)&local_a8,(btVector3 *)((long)(pNVar4->m_x).m_floats + uVar8),r);
    pbVar7 = btDbvt::insert(&this->m_ndbvt,(btDbvtVolume *)&local_a8,
                            (void *)((long)&(((Node *)(&pNVar4->m_x + -1))->super_Feature).
                                            super_Element.m_tag + uVar8));
    *(btDbvtNode **)((long)(&pNVar4->m_n + 1) + uVar8 + 8) = pbVar7;
    *(Material **)((long)(pNVar4->m_x).m_floats + (uVar8 - 8)) = pMVar6;
  }
  updateBounds(this);
  return;
}

Assistant:

btSoftBody::btSoftBody(btSoftBodyWorldInfo*	worldInfo,int node_count,  const btVector3* x,  const btScalar* m)
:m_softBodySolver(0),m_worldInfo(worldInfo)
{	
	/* Init		*/ 
	initDefaults();

	/* Default material	*/ 
	Material*	pm=appendMaterial();
	pm->m_kLST	=	1;
	pm->m_kAST	=	1;
	pm->m_kVST	=	1;
	pm->m_flags	=	fMaterial::Default;

	/* Nodes			*/ 
	const btScalar		margin=getCollisionShape()->getMargin();
	m_nodes.resize(node_count);
	for(int i=0,ni=node_count;i<ni;++i)
	{	
		Node&	n=m_nodes[i];
		ZeroInitialize(n);
		n.m_x		=	x?*x++:btVector3(0,0,0);
		n.m_q		=	n.m_x;
		n.m_im		=	m?*m++:1;
		n.m_im		=	n.m_im>0?1/n.m_im:0;
		n.m_leaf	=	m_ndbvt.insert(btDbvtVolume::FromCR(n.m_x,margin),&n);
		n.m_material=	pm;
	}
	updateBounds();	

}